

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int64_suite::fail_array64_int64_missing_seven(void)

{
  value_type input [10];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [16];
  decoder local_30;
  
  local_40[8] = '\0';
  local_40[9] = '\x11';
  local_40[0] = 0xde;
  local_40[1] = '\b';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>
            (&local_30,(uchar (*) [10])local_40);
  local_44 = local_30.current.code;
  local_48 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc4c,"void compact_int64_suite::fail_array64_int64_missing_seven()",&local_44,
             &local_48);
  return;
}

Assistant:

void fail_array64_int64_missing_seven()
{
    const value_type input[] = { token::code::array64_int64, 0x08, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x11 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}